

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOptimizationTests.cpp
# Opt level: O3

ProgramData * __thiscall
deqp::gles2::Performance::anon_unknown_1::CommonSubexpressionCase::generateProgramData
          (ProgramData *__return_storage_ptr__,CommonSubexpressionCase *this,bool optimized)

{
  CaseShaderType CVar1;
  long *plVar2;
  undefined8 *puVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined8 uVar5;
  char *pcVar6;
  undefined8 *puVar7;
  ulong *puVar8;
  size_type *psVar9;
  int iVar10;
  pointer pcVar11;
  ulong uVar12;
  _Alloc_hider _Var13;
  uint uVar14;
  size_type __dnew_1;
  size_type __dnew;
  string statements;
  size_type __dnew_2;
  ostringstream s;
  string local_3a0;
  string local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  string local_300;
  string local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string local_260;
  uint local_23c;
  CommonSubexpressionCase *local_238;
  ulong *local_230;
  long local_228;
  ulong local_220 [2];
  ulong *local_210;
  long local_208;
  ulong local_200 [2];
  pointer *local_1f0;
  long local_1e8;
  pointer local_1e0 [2];
  string local_1d0 [3];
  ios_base local_160 [264];
  ProgramData *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  CVar1 = (this->super_ShaderOptimizationCase).m_caseShaderType;
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  if (CVar1 == CASESHADERTYPE_FRAGMENT) {
    pcVar6 = local_2c0.field_2._M_local_buf + 7;
    local_2c0.field_2._M_local_buf[4] = 'u';
    local_2c0.field_2._M_allocated_capacity._5_2_ = 0x706d;
    local_2c0.field_2._M_allocated_capacity._0_4_ = 0x6964656d;
    local_2c0._M_string_length = 7;
  }
  else {
    if (CVar1 != CASESHADERTYPE_VERTEX) {
      std::__throw_logic_error("basic_string::_M_construct null not valid");
      goto switchD_0101928f_default;
    }
    pcVar6 = local_2c0.field_2._M_local_buf + 5;
    local_2c0.field_2._M_local_buf[4] = 'p';
    local_2c0.field_2._M_allocated_capacity._0_4_ = 0x68676968;
    local_2c0._M_string_length = 5;
  }
  *pcVar6 = '\0';
  switch(this->m_caseType) {
  case CASETYPE_SINGLE_STATEMENT:
    iVar10 = (uint)(CVar1 == CASESHADERTYPE_VERTEX) * 3 + 1;
    if (!optimized) {
      local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
      local_340._M_dataplus._M_p = (pointer)0x4d;
      local_238 = this;
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)std::__cxx11::string::_M_create((ulong *)&local_3a0,(ulong)&local_340);
      _Var13._M_p = local_340._M_dataplus._M_p;
      local_3a0.field_2._M_allocated_capacity = (size_type)local_340._M_dataplus._M_p;
      local_3a0._M_dataplus._M_p = (pointer)paVar4;
      memcpy(paVar4,"fract(sin(value) + cos(sin(value))) + sqrt(sin(value) + exp(cos(sin(value))))",
             0x4d);
      local_3a0._M_string_length = (size_type)_Var13._M_p;
      paVar4->_M_local_buf[(long)_Var13._M_p] = '\0';
      local_340.field_2._M_allocated_capacity = 0x202020202020090a;
      local_340._M_string_length = 10;
      local_340.field_2._8_3_ = 0x202b;
      local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
      repeat(&local_380,&local_3a0,iVar10,&local_340);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_380,0,(char *)0x0,0x1bde816);
      puVar8 = (ulong *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_1d0[0].field_2._0_8_ = *puVar8;
        local_1d0[0].field_2._8_8_ = plVar2[3];
        local_1d0[0]._M_dataplus._M_p = (pointer)&local_1d0[0].field_2;
      }
      else {
        local_1d0[0].field_2._0_8_ = *puVar8;
        local_1d0[0]._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_1d0[0]._M_string_length = plVar2[1];
      *plVar2 = (long)puVar8;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)local_1d0);
      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      puVar8 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_2e0.field_2._M_allocated_capacity = *puVar8;
        local_2e0.field_2._8_8_ = puVar3[3];
      }
      else {
        local_2e0.field_2._M_allocated_capacity = *puVar8;
        local_2e0._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_2e0._M_string_length = puVar3[1];
      *puVar3 = puVar8;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0[0]._M_dataplus._M_p != &local_1d0[0].field_2) {
        operator_delete(local_1d0[0]._M_dataplus._M_p,
                        (ulong)(local_1d0[0].field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        operator_delete(local_380._M_dataplus._M_p,
                        (ulong)(local_380.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,
                        (ulong)(local_340.field_2._M_allocated_capacity + 1));
      }
      this = local_238;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p,
                        (ulong)(local_3a0.field_2._M_allocated_capacity + 1));
        this = local_238;
      }
      goto LAB_0101bf38;
    }
    std::operator+(&local_320,"\t",&local_2c0);
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_320);
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    puVar7 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      uVar5 = *puVar7;
      local_300.field_2._M_local_buf[0] = (char)uVar5;
      local_300.field_2._M_allocated_capacity._1_6_ = (undefined6)((ulong)uVar5 >> 8);
      local_300.field_2._M_local_buf[7] = (char)((ulong)uVar5 >> 0x38);
      local_300.field_2._8_7_ = (undefined7)puVar3[3];
      local_300.field_2._M_local_buf[0xf] = (char)((ulong)puVar3[3] >> 0x38);
    }
    else {
      uVar5 = *puVar7;
      local_300.field_2._M_local_buf[0] = (char)uVar5;
      local_300.field_2._M_allocated_capacity._1_6_ = (undefined6)((ulong)uVar5 >> 8);
      local_300.field_2._M_local_buf[7] = (char)((ulong)uVar5 >> 0x38);
      local_300._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_300._M_string_length = puVar3[1];
    *puVar3 = puVar7;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_2c0._M_dataplus._M_p);
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    puVar8 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_360.field_2._M_allocated_capacity = *puVar8;
      local_360.field_2._8_8_ = puVar3[3];
    }
    else {
      local_360.field_2._M_allocated_capacity = *puVar8;
      local_360._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_360._M_string_length = puVar3[1];
    *puVar3 = puVar8;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_360);
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    puVar8 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_340.field_2._M_allocated_capacity = *puVar8;
      local_340.field_2._8_8_ = puVar3[3];
    }
    else {
      local_340.field_2._M_allocated_capacity = *puVar8;
      local_340._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_340._M_string_length = puVar3[1];
    *puVar3 = puVar8;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_340,(ulong)local_2c0._M_dataplus._M_p);
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    puVar8 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_3a0.field_2._M_allocated_capacity = *puVar8;
      local_3a0.field_2._8_8_ = puVar3[3];
    }
    else {
      local_3a0.field_2._M_allocated_capacity = *puVar8;
      local_3a0._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_3a0._M_string_length = puVar3[1];
    *puVar3 = puVar8;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_3a0);
    paVar4 = &local_380.field_2;
    puVar8 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_380.field_2._M_allocated_capacity = *puVar8;
      local_380.field_2._8_8_ = puVar3[3];
      local_380._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_380.field_2._M_allocated_capacity = *puVar8;
      local_380._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_380._M_string_length = puVar3[1];
    *puVar3 = puVar8;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    local_2a0.field_2._M_allocated_capacity._0_2_ = 100;
    local_2a0._M_string_length = 1;
    local_260.field_2._M_allocated_capacity._0_2_ = 0x2b;
    local_260._M_string_length = 1;
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    repeat(&local_280,&local_2a0,iVar10,&local_260);
    uVar5 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != paVar4) {
      uVar5 = local_380.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar5 < (pointer)(local_280._M_string_length + local_380._M_string_length)) {
      uVar5 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        uVar5 = local_280.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar5 < (pointer)(local_280._M_string_length + local_380._M_string_length))
      goto LAB_0101b47f;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_280,0,(char *)0x0,(ulong)local_380._M_dataplus._M_p);
    }
    else {
LAB_0101b47f:
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_380,(ulong)local_280._M_dataplus._M_p)
      ;
    }
    local_1d0[0]._M_dataplus._M_p = (pointer)&local_1d0[0].field_2;
    puVar8 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_1d0[0].field_2._0_8_ = *puVar8;
      local_1d0[0].field_2._8_8_ = puVar3[3];
    }
    else {
      local_1d0[0].field_2._0_8_ = *puVar8;
      local_1d0[0]._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_1d0[0]._M_string_length = puVar3[1];
    *puVar3 = puVar8;
    puVar3[1] = 0;
    *(undefined1 *)puVar8 = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)local_1d0);
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    puVar8 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_2e0.field_2._M_allocated_capacity = *puVar8;
      local_2e0.field_2._8_8_ = puVar3[3];
    }
    else {
      local_2e0.field_2._M_allocated_capacity = *puVar8;
      local_2e0._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_2e0._M_string_length = puVar3[1];
    *puVar3 = puVar8;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0[0]._M_dataplus._M_p != &local_1d0[0].field_2) {
      operator_delete(local_1d0[0]._M_dataplus._M_p,
                      (ulong)(local_1d0[0].field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,
                      (ulong)(local_280.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,
                      (ulong)(local_260.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != paVar4) {
      operator_delete(local_380._M_dataplus._M_p,
                      (ulong)(local_380.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,
                      (ulong)(local_3a0.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,
                      (ulong)(local_340.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,
                      (ulong)(local_360.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,
                      CONCAT17(local_300.field_2._M_local_buf[7],
                               CONCAT61(local_300.field_2._M_allocated_capacity._1_6_,
                                        local_300.field_2._M_local_buf[0])) + 1);
    }
    uVar5 = local_320.field_2._M_allocated_capacity;
    _Var13._M_p = local_320._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p == &local_320.field_2) goto LAB_0101bf38;
    break;
  case CASETYPE_MULTIPLE_STATEMENTS:
    iVar10 = (uint)(CVar1 == CASESHADERTYPE_VERTEX) * 2 + 2;
    if (optimized) {
      std::operator+(&local_340,"\t",&local_2c0);
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_340);
      local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
      puVar8 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_3a0.field_2._M_allocated_capacity = *puVar8;
        local_3a0.field_2._8_8_ = puVar3[3];
      }
      else {
        local_3a0.field_2._M_allocated_capacity = *puVar8;
        local_3a0._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_3a0._M_string_length = puVar3[1];
      *puVar3 = puVar8;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_2c0._M_dataplus._M_p)
      ;
      local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
      puVar8 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_380.field_2._M_allocated_capacity = *puVar8;
        local_380.field_2._8_8_ = puVar3[3];
      }
      else {
        local_380.field_2._M_allocated_capacity = *puVar8;
        local_380._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_380._M_string_length = puVar3[1];
      *puVar3 = puVar8;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_380);
      paVar4 = &local_1d0[0].field_2;
      puVar8 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_1d0[0].field_2._0_8_ = *puVar8;
        local_1d0[0].field_2._8_8_ = puVar3[3];
        local_1d0[0]._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        local_1d0[0].field_2._0_8_ = *puVar8;
        local_1d0[0]._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_1d0[0]._M_string_length = puVar3[1];
      *puVar3 = puVar8;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      local_300.field_2._M_local_buf[0] = '\t';
      local_300.field_2._M_allocated_capacity._1_6_ = 0x2065756c6176;
      local_300.field_2._M_local_buf[7] = '+';
      local_300.field_2._8_7_ = 0xa3b622a61203d;
      local_300._M_string_length = 0xf;
      local_300.field_2._M_local_buf[0xf] = '\0';
      local_320._M_string_length = 0;
      local_320.field_2._M_allocated_capacity =
           local_320.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      repeat(&local_360,&local_300,iVar10,&local_320);
      uVar5 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0[0]._M_dataplus._M_p != paVar4) {
        uVar5 = local_1d0[0].field_2._M_allocated_capacity;
      }
      if ((ulong)uVar5 < (pointer)(local_360._M_string_length + local_1d0[0]._M_string_length)) {
        uVar5 = (pointer)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          uVar5 = local_360.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar5 < (pointer)(local_360._M_string_length + local_1d0[0]._M_string_length))
        goto LAB_0101b203;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_360,0,(char *)0x0,(ulong)local_1d0[0]._M_dataplus._M_p);
      }
      else {
LAB_0101b203:
        puVar3 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)local_1d0,(ulong)local_360._M_dataplus._M_p);
      }
      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      puVar8 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_2e0.field_2._M_allocated_capacity = *puVar8;
        local_2e0.field_2._8_8_ = puVar3[3];
      }
      else {
        local_2e0.field_2._M_allocated_capacity = *puVar8;
        local_2e0._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_2e0._M_string_length = puVar3[1];
      *puVar3 = puVar8;
      puVar3[1] = 0;
      *(undefined1 *)puVar8 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,
                        (ulong)(local_360.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,
                        CONCAT17(local_300.field_2._M_local_buf[7],
                                 CONCAT61(local_300.field_2._M_allocated_capacity._1_6_,
                                          local_300.field_2._M_local_buf[0])) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0[0]._M_dataplus._M_p != paVar4) {
        operator_delete(local_1d0[0]._M_dataplus._M_p,
                        (ulong)(local_1d0[0].field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        operator_delete(local_380._M_dataplus._M_p,
                        (ulong)(local_380.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p == &local_3a0.field_2) goto LAB_0101b59f;
      goto LAB_0101b592;
    }
    std::operator+(&local_360,"\t",&local_2c0);
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_360);
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    puVar8 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_340.field_2._M_allocated_capacity = *puVar8;
      local_340.field_2._8_8_ = puVar3[3];
    }
    else {
      local_340.field_2._M_allocated_capacity = *puVar8;
      local_340._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_340._M_string_length = puVar3[1];
    *puVar3 = puVar8;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_340,(ulong)local_2c0._M_dataplus._M_p);
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    puVar8 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_3a0.field_2._M_allocated_capacity = *puVar8;
      local_3a0.field_2._8_8_ = puVar3[3];
    }
    else {
      local_3a0.field_2._M_allocated_capacity = *puVar8;
      local_3a0._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_3a0._M_string_length = puVar3[1];
    *puVar3 = puVar8;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_3a0);
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    puVar8 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_380.field_2._M_allocated_capacity = *puVar8;
      local_380.field_2._8_8_ = puVar3[3];
    }
    else {
      local_380.field_2._M_allocated_capacity = *puVar8;
      local_380._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_380._M_string_length = puVar3[1];
    *puVar3 = puVar8;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    local_300._M_string_length = 0;
    local_300.field_2._M_local_buf[0] = '\0';
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    repeatIndexedTemplate(local_1d0,&local_380,iVar10,&local_300,0);
    local_2a0._M_dataplus._M_p = (pointer)0x1b;
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    local_280._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_280,(ulong)&local_2a0);
    local_280.field_2._M_allocated_capacity = (size_type)local_2a0._M_dataplus._M_p;
    builtin_strncpy((char *)((long)local_280._M_dataplus._M_p + 0xb),"${NDX}*b",8);
    builtin_strncpy((char *)((long)local_280._M_dataplus._M_p + 0x13),"${NDX};\n",8);
    *(undefined8 *)local_280._M_dataplus._M_p = 0x2b2065756c617609;
    *(undefined8 *)((long)local_280._M_dataplus._M_p + 8) = 0x58444e7b2461203d;
    local_280._M_string_length = (size_type)local_2a0._M_dataplus._M_p;
    local_280._M_dataplus._M_p[(long)local_2a0._M_dataplus._M_p] = '\0';
    local_2a0._M_string_length = 0;
    local_2a0.field_2._M_allocated_capacity =
         local_2a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    repeatIndexedTemplate(&local_320,&local_280,iVar10,&local_2a0,0);
    uVar5 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0[0]._M_dataplus._M_p != &local_1d0[0].field_2) {
      uVar5 = local_1d0[0].field_2._M_allocated_capacity;
    }
    if ((ulong)uVar5 < (pointer)(local_320._M_string_length + local_1d0[0]._M_string_length)) {
      uVar5 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        uVar5 = local_320.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar5 < (pointer)(local_320._M_string_length + local_1d0[0]._M_string_length))
      goto LAB_0101b34e;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_320,0,(char *)0x0,(ulong)local_1d0[0]._M_dataplus._M_p);
    }
    else {
LAB_0101b34e:
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_320._M_dataplus._M_p);
    }
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    puVar8 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_2e0.field_2._M_allocated_capacity = *puVar8;
      local_2e0.field_2._8_8_ = puVar3[3];
    }
    else {
      local_2e0.field_2._M_allocated_capacity = *puVar8;
      local_2e0._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_2e0._M_string_length = puVar3[1];
    *puVar3 = puVar8;
    puVar3[1] = 0;
    *(undefined1 *)puVar8 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,
                      (ulong)(local_280.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0[0]._M_dataplus._M_p != &local_1d0[0].field_2) {
      operator_delete(local_1d0[0]._M_dataplus._M_p,
                      (ulong)(local_1d0[0].field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,
                      CONCAT17(local_300.field_2._M_local_buf[7],
                               CONCAT61(local_300.field_2._M_allocated_capacity._1_6_,
                                        local_300.field_2._M_local_buf[0])) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,
                      (ulong)(local_380.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,
                      (ulong)(local_3a0.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,
                      (ulong)(local_340.field_2._M_allocated_capacity + 1));
    }
    uVar5 = local_360.field_2._M_allocated_capacity;
    _Var13._M_p = local_360._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p == &local_360.field_2) goto LAB_0101bf38;
    break;
  case CASETYPE_STATIC_BRANCH:
    local_23c = (uint)(CVar1 == CASESHADERTYPE_VERTEX) * 2 + 2;
    if (!optimized) {
      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      local_2e0._M_string_length = 0;
      local_2e0.field_2._M_allocated_capacity =
           local_2e0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      paVar4 = &local_340.field_2;
      uVar14 = 0;
      local_238 = this;
      local_58 = __return_storage_ptr__;
      do {
        std::operator+(&local_50,"\t",&local_2c0);
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
        puVar8 = (ulong *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar8) {
          local_260.field_2._M_allocated_capacity = *puVar8;
          local_260.field_2._8_8_ = plVar2[3];
        }
        else {
          local_260.field_2._M_allocated_capacity = *puVar8;
          local_260._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_260._M_string_length = plVar2[1];
        *plVar2 = (long)puVar8;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
        std::ostream::operator<<(local_1d0,uVar14);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
        std::ios_base::~ios_base(local_160);
        uVar5 = (pointer)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          uVar5 = local_260.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar5 < (pointer)(local_1e8 + local_260._M_string_length)) {
          pcVar11 = (pointer)0xf;
          if (local_1f0 != local_1e0) {
            pcVar11 = local_1e0[0];
          }
          if (pcVar11 < (pointer)(local_1e8 + local_260._M_string_length)) goto LAB_010195c4;
          puVar3 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_1f0,0,(char *)0x0,(ulong)local_260._M_dataplus._M_p);
        }
        else {
LAB_010195c4:
          puVar3 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_1f0);
        }
        local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
        puVar8 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar8) {
          local_2a0.field_2._M_allocated_capacity = *puVar8;
          local_2a0.field_2._8_8_ = puVar3[3];
        }
        else {
          local_2a0.field_2._M_allocated_capacity = *puVar8;
          local_2a0._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_2a0._M_string_length = puVar3[1];
        *puVar3 = puVar8;
        puVar3[1] = 0;
        *(undefined1 *)puVar8 = 0;
        puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a0);
        local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        puVar8 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar8) {
          local_280.field_2._M_allocated_capacity = *puVar8;
          local_280.field_2._8_8_ = puVar3[3];
        }
        else {
          local_280.field_2._M_allocated_capacity = *puVar8;
          local_280._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_280._M_string_length = puVar3[1];
        *puVar3 = puVar8;
        puVar3[1] = 0;
        *(undefined1 *)(puVar3 + 2) = 0;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_280,(ulong)local_2c0._M_dataplus._M_p);
        local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
        puVar8 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar8) {
          local_320.field_2._M_allocated_capacity = *puVar8;
          local_320.field_2._8_8_ = puVar3[3];
        }
        else {
          local_320.field_2._M_allocated_capacity = *puVar8;
          local_320._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_320._M_string_length = puVar3[1];
        *puVar3 = puVar8;
        puVar3[1] = 0;
        *(undefined1 *)(puVar3 + 2) = 0;
        puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_320);
        local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
        puVar7 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar7) {
          uVar5 = *puVar7;
          local_300.field_2._M_local_buf[0] = (char)uVar5;
          local_300.field_2._M_allocated_capacity._1_6_ = (undefined6)((ulong)uVar5 >> 8);
          local_300.field_2._M_local_buf[7] = (char)((ulong)uVar5 >> 0x38);
          local_300.field_2._8_7_ = (undefined7)puVar3[3];
          local_300.field_2._M_local_buf[0xf] = (char)((ulong)puVar3[3] >> 0x38);
        }
        else {
          uVar5 = *puVar7;
          local_300.field_2._M_local_buf[0] = (char)uVar5;
          local_300.field_2._M_allocated_capacity._1_6_ = (undefined6)((ulong)uVar5 >> 8);
          local_300.field_2._M_local_buf[7] = (char)((ulong)uVar5 >> 0x38);
          local_300._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_300._M_string_length = puVar3[1];
        *puVar3 = puVar7;
        puVar3[1] = 0;
        *(undefined1 *)(puVar3 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
        std::ostream::operator<<(local_1d0,uVar14);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
        std::ios_base::~ios_base(local_160);
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != &local_300.field_2) {
          uVar12 = CONCAT17(local_300.field_2._M_local_buf[7],
                            CONCAT61(local_300.field_2._M_allocated_capacity._1_6_,
                                     local_300.field_2._M_local_buf[0]));
        }
        if (uVar12 < local_208 + local_300._M_string_length) {
          uVar12 = 0xf;
          if (local_210 != local_200) {
            uVar12 = local_200[0];
          }
          if (uVar12 < local_208 + local_300._M_string_length) goto LAB_01019821;
          puVar3 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_210,0,(char *)0x0,(ulong)local_300._M_dataplus._M_p);
        }
        else {
LAB_01019821:
          puVar3 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_210);
        }
        local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
        psVar9 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_360.field_2._M_allocated_capacity = *psVar9;
          local_360.field_2._8_8_ = puVar3[3];
        }
        else {
          local_360.field_2._M_allocated_capacity = *psVar9;
          local_360._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_360._M_string_length = puVar3[1];
        *puVar3 = psVar9;
        puVar3[1] = 0;
        *(undefined1 *)psVar9 = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_360);
        puVar8 = (ulong *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar8) {
          local_340.field_2._M_allocated_capacity = *puVar8;
          local_340.field_2._8_8_ = plVar2[3];
          local_340._M_dataplus._M_p = (pointer)paVar4;
        }
        else {
          local_340.field_2._M_allocated_capacity = *puVar8;
          local_340._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_340._M_string_length = plVar2[1];
        *plVar2 = (long)puVar8;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
        std::ostream::operator<<(local_1d0,uVar14);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
        std::ios_base::~ios_base(local_160);
        uVar5 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != paVar4) {
          uVar5 = local_340.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar5 < local_228 + local_340._M_string_length) {
          uVar12 = 0xf;
          if (local_230 != local_220) {
            uVar12 = local_220[0];
          }
          if (uVar12 < local_228 + local_340._M_string_length) goto LAB_0101996d;
          puVar3 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_230,0,(char *)0x0,(ulong)local_340._M_dataplus._M_p);
        }
        else {
LAB_0101996d:
          puVar3 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_340,(ulong)local_230);
        }
        local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
        psVar9 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_3a0.field_2._M_allocated_capacity = *psVar9;
          local_3a0.field_2._8_8_ = puVar3[3];
        }
        else {
          local_3a0.field_2._M_allocated_capacity = *psVar9;
          local_3a0._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_3a0._M_string_length = puVar3[1];
        *puVar3 = psVar9;
        puVar3[1] = 0;
        *(undefined1 *)psVar9 = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_3a0);
        local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
        psVar9 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_380.field_2._M_allocated_capacity = *psVar9;
          local_380.field_2._8_8_ = plVar2[3];
        }
        else {
          local_380.field_2._M_allocated_capacity = *psVar9;
          local_380._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_380._M_string_length = plVar2[1];
        *plVar2 = (long)psVar9;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_380._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._M_dataplus._M_p != &local_380.field_2) {
          operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
          operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
        }
        if (local_230 != local_220) {
          operator_delete(local_230,local_220[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != paVar4) {
          operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
        }
        if (local_210 != local_200) {
          operator_delete(local_210,local_200[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != &local_300.field_2) {
          operator_delete(local_300._M_dataplus._M_p,
                          CONCAT17(local_300.field_2._M_local_buf[7],
                                   CONCAT61(local_300.field_2._M_allocated_capacity._1_6_,
                                            local_300.field_2._M_local_buf[0])) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,
                          (ulong)(local_280.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
        }
        if (local_1f0 != local_1e0) {
          operator_delete(local_1f0,(ulong)(local_1e0[0] + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,
                          (ulong)(local_260.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (uVar14 % 3 == 2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
          std::ostream::operator<<(local_1d0,uVar14);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
          std::ios_base::~ios_base(local_160);
          puVar3 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,0x1bde9ea);
          local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
          psVar9 = puVar3 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_360.field_2._M_allocated_capacity = *psVar9;
            local_360.field_2._8_8_ = puVar3[3];
          }
          else {
            local_360.field_2._M_allocated_capacity = *psVar9;
            local_360._M_dataplus._M_p = (pointer)*puVar3;
          }
          local_360._M_string_length = puVar3[1];
          *puVar3 = psVar9;
          puVar3[1] = 0;
          *(undefined1 *)(puVar3 + 2) = 0;
          puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_360);
          puVar8 = puVar3 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar8) {
            local_340.field_2._M_allocated_capacity = *puVar8;
            local_340.field_2._8_8_ = puVar3[3];
            local_340._M_dataplus._M_p = (pointer)paVar4;
          }
          else {
            local_340.field_2._M_allocated_capacity = *puVar8;
            local_340._M_dataplus._M_p = (pointer)*puVar3;
          }
          local_340._M_string_length = puVar3[1];
          *puVar3 = puVar8;
          puVar3[1] = 0;
          *(undefined1 *)(puVar3 + 2) = 0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
          std::ostream::operator<<(local_1d0,uVar14);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
          std::ios_base::~ios_base(local_160);
          uVar5 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._M_dataplus._M_p != paVar4) {
            uVar5 = local_340.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar5 < local_320._M_string_length + local_340._M_string_length) {
            uVar5 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_320._M_dataplus._M_p != &local_320.field_2) {
              uVar5 = local_320.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar5 < local_320._M_string_length + local_340._M_string_length)
            goto LAB_0101a045;
            puVar3 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_320,0,(char *)0x0,(ulong)local_340._M_dataplus._M_p);
          }
          else {
LAB_0101a045:
            puVar3 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_340,(ulong)local_320._M_dataplus._M_p);
          }
          local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
          psVar9 = puVar3 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_3a0.field_2._M_allocated_capacity = *psVar9;
            local_3a0.field_2._8_8_ = puVar3[3];
          }
          else {
            local_3a0.field_2._M_allocated_capacity = *psVar9;
            local_3a0._M_dataplus._M_p = (pointer)*puVar3;
          }
          local_3a0._M_string_length = puVar3[1];
          *puVar3 = psVar9;
          puVar3[1] = 0;
          *(undefined1 *)psVar9 = 0;
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_3a0);
          local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
          psVar9 = (size_type *)(plVar2 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar2 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_380.field_2._M_allocated_capacity = *psVar9;
            local_380.field_2._8_8_ = plVar2[3];
          }
          else {
            local_380.field_2._M_allocated_capacity = *psVar9;
            local_380._M_dataplus._M_p = (pointer)*plVar2;
          }
          local_380._M_string_length = plVar2[1];
          *plVar2 = (long)psVar9;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_380._M_dataplus._M_p);
        }
        else if (uVar14 % 3 == 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
          std::ostream::operator<<(local_1d0,uVar14);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
          std::ios_base::~ios_base(local_160);
          plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,0x1bde9de);
          local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
          psVar9 = (size_type *)(plVar2 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar2 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_360.field_2._M_allocated_capacity = *psVar9;
            local_360.field_2._8_8_ = plVar2[3];
          }
          else {
            local_360.field_2._M_allocated_capacity = *psVar9;
            local_360._M_dataplus._M_p = (pointer)*plVar2;
          }
          local_360._M_string_length = plVar2[1];
          *plVar2 = (long)psVar9;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_360);
          puVar8 = (ulong *)(plVar2 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar2 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar8) {
            local_340.field_2._M_allocated_capacity = *puVar8;
            local_340.field_2._8_8_ = plVar2[3];
            local_340._M_dataplus._M_p = (pointer)paVar4;
          }
          else {
            local_340.field_2._M_allocated_capacity = *puVar8;
            local_340._M_dataplus._M_p = (pointer)*plVar2;
          }
          local_340._M_string_length = plVar2[1];
          *plVar2 = (long)puVar8;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
          std::ostream::operator<<(local_1d0,uVar14);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
          std::ios_base::~ios_base(local_160);
          uVar5 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._M_dataplus._M_p != paVar4) {
            uVar5 = local_340.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar5 < local_320._M_string_length + local_340._M_string_length) {
            uVar5 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_320._M_dataplus._M_p != &local_320.field_2) {
              uVar5 = local_320.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar5 < local_320._M_string_length + local_340._M_string_length)
            goto LAB_01019f82;
            puVar3 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_320,0,(char *)0x0,(ulong)local_340._M_dataplus._M_p);
          }
          else {
LAB_01019f82:
            puVar3 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_340,(ulong)local_320._M_dataplus._M_p);
          }
          local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
          psVar9 = puVar3 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_3a0.field_2._M_allocated_capacity = *psVar9;
            local_3a0.field_2._8_8_ = puVar3[3];
          }
          else {
            local_3a0.field_2._M_allocated_capacity = *psVar9;
            local_3a0._M_dataplus._M_p = (pointer)*puVar3;
          }
          local_3a0._M_string_length = puVar3[1];
          *puVar3 = psVar9;
          puVar3[1] = 0;
          *(undefined1 *)psVar9 = 0;
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_3a0);
          local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
          psVar9 = (size_type *)(plVar2 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar2 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_380.field_2._M_allocated_capacity = *psVar9;
            local_380.field_2._8_8_ = plVar2[3];
          }
          else {
            local_380.field_2._M_allocated_capacity = *psVar9;
            local_380._M_dataplus._M_p = (pointer)*plVar2;
          }
          local_380._M_string_length = plVar2[1];
          *plVar2 = (long)psVar9;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_380._M_dataplus._M_p);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
          std::ostream::operator<<(local_1d0,uVar14);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
          std::ios_base::~ios_base(local_160);
          puVar3 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,0x1bde9d1);
          local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
          psVar9 = puVar3 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_360.field_2._M_allocated_capacity = *psVar9;
            local_360.field_2._8_8_ = puVar3[3];
          }
          else {
            local_360.field_2._M_allocated_capacity = *psVar9;
            local_360._M_dataplus._M_p = (pointer)*puVar3;
          }
          local_360._M_string_length = puVar3[1];
          *puVar3 = psVar9;
          puVar3[1] = 0;
          *(undefined1 *)(puVar3 + 2) = 0;
          puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_360);
          puVar8 = puVar3 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar8) {
            local_340.field_2._M_allocated_capacity = *puVar8;
            local_340.field_2._8_8_ = puVar3[3];
            local_340._M_dataplus._M_p = (pointer)paVar4;
          }
          else {
            local_340.field_2._M_allocated_capacity = *puVar8;
            local_340._M_dataplus._M_p = (pointer)*puVar3;
          }
          local_340._M_string_length = puVar3[1];
          *puVar3 = puVar8;
          puVar3[1] = 0;
          *(undefined1 *)(puVar3 + 2) = 0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
          std::ostream::operator<<(local_1d0,uVar14);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
          std::ios_base::~ios_base(local_160);
          uVar5 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._M_dataplus._M_p != paVar4) {
            uVar5 = local_340.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar5 < local_320._M_string_length + local_340._M_string_length) {
            uVar5 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_320._M_dataplus._M_p != &local_320.field_2) {
              uVar5 = local_320.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar5 < local_320._M_string_length + local_340._M_string_length)
            goto LAB_0101a108;
            puVar3 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_320,0,(char *)0x0,(ulong)local_340._M_dataplus._M_p);
          }
          else {
LAB_0101a108:
            puVar3 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_340,(ulong)local_320._M_dataplus._M_p);
          }
          local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
          psVar9 = puVar3 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_3a0.field_2._M_allocated_capacity = *psVar9;
            local_3a0.field_2._8_8_ = puVar3[3];
          }
          else {
            local_3a0.field_2._M_allocated_capacity = *psVar9;
            local_3a0._M_dataplus._M_p = (pointer)*puVar3;
          }
          local_3a0._M_string_length = puVar3[1];
          *puVar3 = psVar9;
          puVar3[1] = 0;
          *(undefined1 *)psVar9 = 0;
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_3a0);
          local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
          psVar9 = (size_type *)(plVar2 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar2 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_380.field_2._M_allocated_capacity = *psVar9;
            local_380.field_2._8_8_ = plVar2[3];
          }
          else {
            local_380.field_2._M_allocated_capacity = *psVar9;
            local_380._M_dataplus._M_p = (pointer)*plVar2;
          }
          local_380._M_string_length = plVar2[1];
          *plVar2 = (long)psVar9;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_380._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._M_dataplus._M_p != &local_380.field_2) {
          operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
          operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != paVar4) {
          operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != &local_300.field_2) {
          operator_delete(local_300._M_dataplus._M_p,
                          CONCAT17(local_300.field_2._M_local_buf[7],
                                   CONCAT61(local_300.field_2._M_allocated_capacity._1_6_,
                                            local_300.field_2._M_local_buf[0])) + 1);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
        std::ostream::operator<<(local_1d0,uVar14);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
        std::ios_base::~ios_base(local_160);
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,0x1bdea01);
        local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
        puVar8 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar8) {
          local_360.field_2._M_allocated_capacity = *puVar8;
          local_360.field_2._8_8_ = puVar3[3];
        }
        else {
          local_360.field_2._M_allocated_capacity = *puVar8;
          local_360._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_360._M_string_length = puVar3[1];
        *puVar3 = puVar8;
        puVar3[1] = 0;
        *(undefined1 *)(puVar3 + 2) = 0;
        puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_360);
        puVar8 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar8) {
          local_340.field_2._M_allocated_capacity = *puVar8;
          local_340.field_2._8_8_ = puVar3[3];
          local_340._M_dataplus._M_p = (pointer)paVar4;
        }
        else {
          local_340.field_2._M_allocated_capacity = *puVar8;
          local_340._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_340._M_string_length = puVar3[1];
        *puVar3 = puVar8;
        puVar3[1] = 0;
        *(undefined1 *)(puVar3 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
        std::ostream::operator<<(local_1d0,uVar14);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
        std::ios_base::~ios_base(local_160);
        uVar5 = (pointer)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != paVar4) {
          uVar5 = local_340.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar5 < (pointer)(local_320._M_string_length + local_340._M_string_length)) {
          uVar5 = (pointer)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320._M_dataplus._M_p != &local_320.field_2) {
            uVar5 = local_320.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar5 < (pointer)(local_320._M_string_length + local_340._M_string_length))
          goto LAB_0101a5b1;
          puVar3 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_320,0,(char *)0x0,(ulong)local_340._M_dataplus._M_p);
        }
        else {
LAB_0101a5b1:
          puVar3 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_340,(ulong)local_320._M_dataplus._M_p);
        }
        local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
        puVar8 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar8) {
          local_3a0.field_2._M_allocated_capacity = *puVar8;
          local_3a0.field_2._8_8_ = puVar3[3];
        }
        else {
          local_3a0.field_2._M_allocated_capacity = *puVar8;
          local_3a0._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_3a0._M_string_length = puVar3[1];
        *puVar3 = puVar8;
        puVar3[1] = 0;
        *(undefined1 *)puVar8 = 0;
        puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_3a0);
        local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
        puVar8 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar8) {
          local_380.field_2._M_allocated_capacity = *puVar8;
          local_380.field_2._8_8_ = puVar3[3];
        }
        else {
          local_380.field_2._M_allocated_capacity = *puVar8;
          local_380._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_380._M_string_length = puVar3[1];
        *puVar3 = puVar8;
        puVar3[1] = 0;
        *(undefined1 *)(puVar3 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_380._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._M_dataplus._M_p != &local_380.field_2) {
          operator_delete(local_380._M_dataplus._M_p,
                          (ulong)(local_380.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
          operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != paVar4) {
          operator_delete(local_340._M_dataplus._M_p,
                          (ulong)(local_340.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,
                          (ulong)(local_360.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != &local_300.field_2) {
          operator_delete(local_300._M_dataplus._M_p,
                          CONCAT17(local_300.field_2._M_local_buf[7],
                                   CONCAT61(local_300.field_2._M_allocated_capacity._1_6_,
                                            local_300.field_2._M_local_buf[0])) + 1);
        }
        uVar14 = uVar14 + 1;
      } while (local_23c != uVar14);
      local_3a0._M_dataplus._M_p = (pointer)0x1b;
      local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
      local_380._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_380,(ulong)&local_3a0);
      local_380.field_2._M_allocated_capacity = (size_type)local_3a0._M_dataplus._M_p;
      builtin_strncpy((char *)((long)local_380._M_dataplus._M_p + 0xb),"${NDX}*b",8);
      builtin_strncpy((char *)((long)local_380._M_dataplus._M_p + 0x13),"${NDX};\n",8);
      *(undefined8 *)local_380._M_dataplus._M_p = 0x2b2065756c617609;
      *(undefined8 *)((long)local_380._M_dataplus._M_p + 8) = 0x58444e7b2461203d;
      local_380._M_string_length = (size_type)local_3a0._M_dataplus._M_p;
      local_380._M_dataplus._M_p[(long)local_3a0._M_dataplus._M_p] = '\0';
      local_3a0._M_string_length = 0;
      local_3a0.field_2._M_allocated_capacity =
           local_3a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
      repeatIndexedTemplate(local_1d0,&local_380,local_23c,&local_3a0,0);
      this = local_238;
      std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_1d0[0]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0[0]._M_dataplus._M_p != &local_1d0[0].field_2) {
        operator_delete(local_1d0[0]._M_dataplus._M_p,
                        (ulong)(local_1d0[0].field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p,
                        (ulong)(local_3a0.field_2._M_allocated_capacity + 1));
      }
      uVar5 = local_380.field_2._M_allocated_capacity;
      _Var13._M_p = local_380._M_dataplus._M_p;
      __return_storage_ptr__ = local_58;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p == &local_380.field_2) goto LAB_0101bf38;
      break;
    }
    std::operator+(&local_340,"\t",&local_2c0);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_340);
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    puVar8 = (ulong *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_3a0.field_2._M_allocated_capacity = *puVar8;
      local_3a0.field_2._8_8_ = plVar2[3];
    }
    else {
      local_3a0.field_2._M_allocated_capacity = *puVar8;
      local_3a0._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_3a0._M_string_length = plVar2[1];
    *plVar2 = (long)puVar8;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_2c0._M_dataplus._M_p);
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    puVar8 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_380.field_2._M_allocated_capacity = *puVar8;
      local_380.field_2._8_8_ = puVar3[3];
    }
    else {
      local_380.field_2._M_allocated_capacity = *puVar8;
      local_380._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_380._M_string_length = puVar3[1];
    *puVar3 = puVar8;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_380);
    paVar4 = &local_1d0[0].field_2;
    puVar8 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_1d0[0].field_2._0_8_ = *puVar8;
      local_1d0[0].field_2._8_8_ = puVar3[3];
      local_1d0[0]._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_1d0[0].field_2._0_8_ = *puVar8;
      local_1d0[0]._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_1d0[0]._M_string_length = puVar3[1];
    *puVar3 = puVar8;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    local_300.field_2._M_local_buf[0] = '\t';
    local_300.field_2._M_allocated_capacity._1_6_ = 0x2065756c6176;
    local_300.field_2._M_local_buf[7] = '+';
    local_300.field_2._8_7_ = 0xa3b622a61203d;
    local_300._M_string_length = 0xf;
    local_300.field_2._M_local_buf[0xf] = '\0';
    local_320._M_string_length = 0;
    local_320.field_2._M_allocated_capacity =
         local_320.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    repeat(&local_360,&local_300,local_23c,&local_320);
    uVar5 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0[0]._M_dataplus._M_p != paVar4) {
      uVar5 = local_1d0[0].field_2._M_allocated_capacity;
    }
    if ((ulong)uVar5 < (pointer)(local_360._M_string_length + local_1d0[0]._M_string_length)) {
      uVar5 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        uVar5 = local_360.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar5 < (pointer)(local_360._M_string_length + local_1d0[0]._M_string_length))
      goto LAB_0101b01c;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_360,0,(char *)0x0,(ulong)local_1d0[0]._M_dataplus._M_p);
    }
    else {
LAB_0101b01c:
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_360._M_dataplus._M_p);
    }
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    puVar8 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_2e0.field_2._M_allocated_capacity = *puVar8;
      local_2e0.field_2._8_8_ = puVar3[3];
    }
    else {
      local_2e0.field_2._M_allocated_capacity = *puVar8;
      local_2e0._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_2e0._M_string_length = puVar3[1];
    *puVar3 = puVar8;
    puVar3[1] = 0;
    *(undefined1 *)puVar8 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,
                      (ulong)(local_360.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,
                      CONCAT17(local_300.field_2._M_local_buf[7],
                               CONCAT61(local_300.field_2._M_allocated_capacity._1_6_,
                                        local_300.field_2._M_local_buf[0])) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0[0]._M_dataplus._M_p != paVar4) {
      operator_delete(local_1d0[0]._M_dataplus._M_p,
                      (ulong)(local_1d0[0].field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,
                      (ulong)(local_380.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) goto LAB_0101b592;
    goto LAB_0101b59f;
  case CASETYPE_LOOP:
    iVar10 = 4;
    if (CVar1 == CASESHADERTYPE_VERTEX) {
      iVar10 = 0x20;
    }
    if (!optimized) {
      std::operator+(&local_280,"\t",&local_2c0);
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_280);
      puVar8 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_320.field_2._M_allocated_capacity = *puVar8;
        local_320.field_2._8_8_ = puVar3[3];
        local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
      }
      else {
        local_320.field_2._M_allocated_capacity = *puVar8;
        local_320._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_320._M_string_length = puVar3[1];
      *puVar3 = puVar8;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
      std::ostream::operator<<(local_1d0,iVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
      std::ios_base::~ios_base(local_160);
      uVar5 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        uVar5 = local_320.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar5 < local_2a0._M_string_length + local_320._M_string_length) {
        uVar5 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          uVar5 = local_2a0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar5 < local_2a0._M_string_length + local_320._M_string_length)
        goto LAB_0101ac04;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_2a0,0,(char *)0x0,(ulong)local_320._M_dataplus._M_p);
      }
      else {
LAB_0101ac04:
        puVar3 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_320,(ulong)local_2a0._M_dataplus._M_p);
      }
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      puVar7 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar7) {
        uVar5 = *puVar7;
        local_300.field_2._M_local_buf[0] = (char)uVar5;
        local_300.field_2._M_allocated_capacity._1_6_ = (undefined6)((ulong)uVar5 >> 8);
        local_300.field_2._M_local_buf[7] = (char)((ulong)uVar5 >> 0x38);
        local_300.field_2._8_7_ = (undefined7)puVar3[3];
        local_300.field_2._M_local_buf[0xf] = (char)((ulong)puVar3[3] >> 0x38);
      }
      else {
        uVar5 = *puVar7;
        local_300.field_2._M_local_buf[0] = (char)uVar5;
        local_300.field_2._M_allocated_capacity._1_6_ = (undefined6)((ulong)uVar5 >> 8);
        local_300.field_2._M_local_buf[7] = (char)((ulong)uVar5 >> 0x38);
        local_300._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_300._M_string_length = puVar3[1];
      *puVar3 = puVar7;
      puVar3[1] = 0;
      *(undefined1 *)puVar7 = 0;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_300);
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      puVar8 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_360.field_2._M_allocated_capacity = *puVar8;
        local_360.field_2._8_8_ = puVar3[3];
      }
      else {
        local_360.field_2._M_allocated_capacity = *puVar8;
        local_360._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_360._M_string_length = puVar3[1];
      *puVar3 = puVar8;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_360,(ulong)local_2c0._M_dataplus._M_p)
      ;
      puVar8 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_340.field_2._M_allocated_capacity = *puVar8;
        local_340.field_2._8_8_ = puVar3[3];
        local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
      }
      else {
        local_340.field_2._M_allocated_capacity = *puVar8;
        local_340._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_340._M_string_length = puVar3[1];
      *puVar3 = puVar8;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_340);
      paVar4 = &local_3a0.field_2;
      puVar8 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_3a0.field_2._M_allocated_capacity = *puVar8;
        local_3a0.field_2._8_8_ = puVar3[3];
        local_3a0._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        local_3a0.field_2._M_allocated_capacity = *puVar8;
        local_3a0._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_3a0._M_string_length = puVar3[1];
      *puVar3 = puVar8;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
      std::ostream::operator<<(local_1d0,iVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
      std::ios_base::~ios_base(local_160);
      uVar5 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != paVar4) {
        uVar5 = local_3a0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar5 < (pointer)(local_3a0._M_string_length + local_260._M_string_length)) {
        uVar5 = (pointer)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          uVar5 = local_260.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar5 < (pointer)(local_3a0._M_string_length + local_260._M_string_length))
        goto LAB_0101b8d9;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_260,0,(char *)0x0,(ulong)local_3a0._M_dataplus._M_p);
      }
      else {
LAB_0101b8d9:
        puVar3 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_3a0,(ulong)local_260._M_dataplus._M_p);
      }
      local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
      puVar8 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_380.field_2._M_allocated_capacity = *puVar8;
        local_380.field_2._8_8_ = puVar3[3];
      }
      else {
        local_380.field_2._M_allocated_capacity = *puVar8;
        local_380._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_380._M_string_length = puVar3[1];
      *puVar3 = puVar8;
      puVar3[1] = 0;
      *(char *)puVar8 = '\0';
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_380);
      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      puVar8 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_2e0.field_2._M_allocated_capacity = *puVar8;
        local_2e0.field_2._8_8_ = puVar3[3];
      }
      else {
        local_2e0.field_2._M_allocated_capacity = *puVar8;
        local_2e0._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_2e0._M_string_length = puVar3[1];
      *puVar3 = puVar8;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        operator_delete(local_380._M_dataplus._M_p,
                        (ulong)(local_380.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,
                        (ulong)(local_260.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != paVar4) {
        operator_delete(local_3a0._M_dataplus._M_p,
                        (ulong)(local_3a0.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,
                        (ulong)(local_340.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,
                        (ulong)(local_360.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,
                        CONCAT17(local_300.field_2._M_local_buf[7],
                                 CONCAT61(local_300.field_2._M_allocated_capacity._1_6_,
                                          local_300.field_2._M_local_buf[0])) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
      }
      uVar5 = local_280.field_2._M_allocated_capacity;
      _Var13._M_p = local_280._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p == &local_280.field_2) goto LAB_0101bf38;
      break;
    }
    std::operator+(&local_340,"\t",&local_2c0);
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_340);
    paVar4 = &local_3a0.field_2;
    puVar8 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_3a0.field_2._M_allocated_capacity = *puVar8;
      local_3a0.field_2._8_8_ = puVar3[3];
      local_3a0._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_3a0.field_2._M_allocated_capacity = *puVar8;
      local_3a0._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_3a0._M_string_length = puVar3[1];
    *puVar3 = puVar8;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
    std::ostream::operator<<(local_1d0,iVar10);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
    std::ios_base::~ios_base(local_160);
    uVar5 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != paVar4) {
      uVar5 = local_3a0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar5 < (pointer)(local_3a0._M_string_length + local_360._M_string_length)) {
      uVar5 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        uVar5 = local_360.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar5 < (pointer)(local_3a0._M_string_length + local_360._M_string_length))
      goto LAB_0101ab23;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_360,0,(char *)0x0,(ulong)local_3a0._M_dataplus._M_p);
    }
    else {
LAB_0101ab23:
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_360._M_dataplus._M_p)
      ;
    }
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    puVar8 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_380.field_2._M_allocated_capacity = *puVar8;
      local_380.field_2._8_8_ = puVar3[3];
    }
    else {
      local_380.field_2._M_allocated_capacity = *puVar8;
      local_380._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_380._M_string_length = puVar3[1];
    *puVar3 = puVar8;
    puVar3[1] = 0;
    *(char *)puVar8 = '\0';
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_380);
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    puVar8 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_2e0.field_2._M_allocated_capacity = *puVar8;
      local_2e0.field_2._8_8_ = puVar3[3];
    }
    else {
      local_2e0.field_2._M_allocated_capacity = *puVar8;
      local_2e0._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_2e0._M_string_length = puVar3[1];
    *puVar3 = puVar8;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,
                      (ulong)(local_380.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,
                      (ulong)(local_360.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p == paVar4) goto LAB_0101b59f;
LAB_0101b592:
    operator_delete(local_3a0._M_dataplus._M_p,(ulong)(local_3a0.field_2._M_allocated_capacity + 1))
    ;
LAB_0101b59f:
    uVar5 = local_340.field_2._M_allocated_capacity;
    _Var13._M_p = local_340._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p == &local_340.field_2) goto LAB_0101bf38;
    break;
  default:
switchD_0101928f_default:
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    uVar5 = std::__throw_logic_error("basic_string::_M_construct null not valid");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0[0]._M_dataplus._M_p != &local_1d0[0].field_2) {
      operator_delete(local_1d0[0]._M_dataplus._M_p,
                      (ulong)(local_1d0[0].field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,
                      (ulong)(local_380.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,
                      CONCAT17(local_2c0.field_2._M_local_buf[7],
                               CONCAT25(local_2c0.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_2c0.field_2._M_local_buf[4],
                                                 local_2c0.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    _Unwind_Resume(uVar5);
  }
  operator_delete(_Var13._M_p,(ulong)(uVar5 + 1));
LAB_0101bf38:
  local_1d0[0]._M_string_length = 0;
  local_1d0[0].field_2._M_allocated_capacity =
       local_1d0[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_1d0[0]._M_dataplus._M_p = (pointer)&local_1d0[0].field_2;
  defaultProgramData(__return_storage_ptr__,(this->super_ShaderOptimizationCase).m_caseShaderType,
                     local_1d0,&local_2e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0[0]._M_dataplus._M_p != &local_1d0[0].field_2) {
    operator_delete(local_1d0[0]._M_dataplus._M_p,local_1d0[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,
                    CONCAT17(local_2c0.field_2._M_local_buf[7],
                             CONCAT25(local_2c0.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_2c0.field_2._M_local_buf[4],
                                               local_2c0.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

ProgramData generateProgramData (bool optimized) const
	{
		const bool		isVertexCase	= m_caseShaderType == CASESHADERTYPE_VERTEX;
		const string	precision		= getShaderPrecision(m_caseShaderType);
		const string	statements		= m_caseType == CASETYPE_SINGLE_STATEMENT		? singleStatementCaseStatements		(optimized, precision, isVertexCase)
										: m_caseType == CASETYPE_MULTIPLE_STATEMENTS	? multipleStatementsCaseStatements	(optimized, precision, isVertexCase)
										: m_caseType == CASETYPE_STATIC_BRANCH			? staticBranchCaseStatements		(optimized, precision, isVertexCase)
										: m_caseType == CASETYPE_LOOP					? loopCaseStatements				(optimized, precision, isVertexCase)
										: DE_NULL;

		return defaultProgramData(m_caseShaderType, statements);
	}